

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O0

bool __thiscall ON_Mesh::EvaluatePoint(ON_Mesh *this,ON_ObjRef *objref,ON_3dPoint *P)

{
  ON_COMPONENT_INDEX OVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ON_MeshTopologyVertex *pOVar6;
  ON_3fPoint *pOVar7;
  ON_3dPoint local_1a0;
  ON_3dPoint local_188;
  ON_3dPoint local_170;
  ON_3dPoint local_158;
  ON_3dPoint local_140;
  ON_3dPoint local_128;
  ON_3dPoint local_110;
  undefined1 local_f8 [8];
  ON_3dPoint V [4];
  int *fvi;
  double local_88;
  double local_80;
  undefined1 local_68 [8];
  ON_Line L;
  int vi;
  ON_MeshTopologyVertex *topv;
  ON_COMPONENT_INDEX ci;
  ON_3dPoint *P_local;
  ON_ObjRef *objref_local;
  ON_Mesh *this_local;
  
  P->z = ON_3dPoint::UnsetPoint.z;
  dVar2 = ON_3dPoint::UnsetPoint.y;
  P->x = ON_3dPoint::UnsetPoint.x;
  P->y = dVar2;
  OVar1 = objref->m_component_index;
  topv._0_4_ = OVar1.m_type;
  topv._4_4_ = OVar1.m_index;
  switch((TYPE)topv) {
  case mesh_vertex:
    if ((-1 < (long)OVar1) &&
       (iVar4 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>),
       topv._4_4_ < iVar4)) {
      pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,topv._4_4_);
      ON_3dPoint::operator=(P,pOVar7);
    }
    break;
  case meshtop_vertex:
    if (((-1 < (long)OVar1) &&
        (iVar4 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&(this->m_top).m_topv),
        topv._4_4_ < iVar4)) &&
       ((pOVar6 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[]
                            (&(this->m_top).m_topv,topv._4_4_), 0 < pOVar6->m_v_count &&
        (((pOVar6->m_vi != (int *)0x0 && (iVar4 = *pOVar6->m_vi, L.to.z._4_4_ = iVar4, -1 < iVar4))
         && (iVar5 = ON_SimpleArray<ON_3fPoint>::Count
                               (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>), iVar4 < iVar5))))))
    {
      pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,L.to.z._4_4_);
      ON_3dPoint::operator=(P,pOVar7);
    }
    break;
  case meshtop_edge:
    if (((objref->m_evp).m_t_type == 5) &&
       (ABS(((objref->m_evp).m_t[0] + (objref->m_evp).m_t[1]) - 1.0) <= 1.490116119385e-08)) {
      ON_MeshTopology::TopEdgeLine((ON_Line *)local_68,&this->m_top,topv._4_4_);
      bVar3 = ON_Line::IsValid((ON_Line *)local_68);
      if (bVar3) {
        ON_Line::PointAt((ON_3dPoint *)&fvi,(ON_Line *)local_68,(objref->m_evp).m_t[0]);
        P->x = (double)fvi;
        P->y = local_88;
        P->z = local_80;
      }
      ON_Line::~ON_Line((ON_Line *)local_68);
    }
    break;
  case mesh_face:
    if (((((((objref->m_evp).m_t_type == 4) &&
           (ABS(((objref->m_evp).m_t[0] + (objref->m_evp).m_t[1] + (objref->m_evp).m_t[2] +
                (objref->m_evp).m_t[3]) - 1.0) <= 1.490116119385e-08)) && (-1 < (long)OVar1)) &&
         (((iVar4 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F), topv._4_4_ < iVar4 &&
           (V[3].z = (double)ON_SimpleArray<ON_MeshFace>::operator[](&this->m_F,topv._4_4_),
           -1 < ((ON_MeshFace *)V[3].z)->vi[0])) &&
          ((iVar4 = ((ON_MeshFace *)V[3].z)->vi[0],
           iVar5 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>),
           iVar4 < iVar5 &&
           ((-1 < *(int *)((long)V[3].z + 4) &&
            (iVar4 = *(int *)((long)V[3].z + 4),
            iVar5 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>)
            , iVar4 < iVar5)))))))) && (-1 < *(int *)((long)V[3].z + 8))) &&
       (((iVar4 = *(int *)((long)V[3].z + 8),
         iVar5 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>),
         iVar4 < iVar5 && (-1 < *(int *)((long)V[3].z + 0xc))) &&
        (iVar4 = *(int *)((long)V[3].z + 0xc),
        iVar5 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>),
        iVar4 < iVar5)))) {
      pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,*(int *)V[3].z);
      ON_3dPoint::operator=((ON_3dPoint *)local_f8,pOVar7);
      pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,*(int *)((long)V[3].z + 4));
      ON_3dPoint::operator=((ON_3dPoint *)&V[0].z,pOVar7);
      pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,*(int *)((long)V[3].z + 8));
      ON_3dPoint::operator=((ON_3dPoint *)&V[1].z,pOVar7);
      pOVar7 = ON_SimpleArray<ON_3fPoint>::operator[]
                         (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,*(int *)((long)V[3].z + 0xc)
                         );
      ON_3dPoint::operator=((ON_3dPoint *)&V[2].z,pOVar7);
      ::operator*(&local_158,(objref->m_evp).m_t[0],(ON_3dPoint *)local_f8);
      ::operator*(&local_170,(objref->m_evp).m_t[1],(ON_3dPoint *)&V[0].z);
      ON_3dPoint::operator+(&local_140,&local_158,&local_170);
      ::operator*(&local_188,(objref->m_evp).m_t[2],(ON_3dPoint *)&V[1].z);
      ON_3dPoint::operator+(&local_128,&local_140,&local_188);
      ::operator*(&local_1a0,(objref->m_evp).m_t[3],(ON_3dPoint *)&V[2].z);
      ON_3dPoint::operator+(&local_110,&local_128,&local_1a0);
      P->x = local_110.x;
      P->y = local_110.y;
      P->z = local_110.z;
    }
  }
  bVar3 = ON_3dPoint::IsValid(P);
  return bVar3;
}

Assistant:

bool ON_Mesh::EvaluatePoint( const class ON_ObjRef& objref, ON_3dPoint& P ) const
{
  // virtual function default
  P = ON_3dPoint::UnsetPoint;
  ON_COMPONENT_INDEX ci = objref.m_component_index;

  switch ( ci.m_type )
  {
  case ON_COMPONENT_INDEX::mesh_vertex:
    if ( ci.m_index >= 0 && ci.m_index < m_V.Count() )
      P = m_V[ci.m_index];
    break;

  case ON_COMPONENT_INDEX::meshtop_vertex:
    if ( ci.m_index >= 0 && ci.m_index < m_top.m_topv.Count() )
    {
      const ON_MeshTopologyVertex& topv = m_top.m_topv[ci.m_index];
      if ( topv.m_v_count > 0 && topv.m_vi )
      {
        int vi = topv.m_vi[0];
        if ( vi >= 0 && vi < m_V.Count() )
          P = m_V[vi];
      }
    }
    break;

  case ON_COMPONENT_INDEX::meshtop_edge:
    if ( 5 == objref.m_evp.m_t_type 
         && fabs(objref.m_evp.m_t[0] + objref.m_evp.m_t[1] - 1.0) <= ON_SQRT_EPSILON )
    {
      ON_Line L = m_top.TopEdgeLine(ci.m_index);
      if ( L.IsValid() )
      {
        P = L.PointAt(objref.m_evp.m_t[0]);
      }
    }
    break;

  case ON_COMPONENT_INDEX::mesh_face:
    if ( 4 == objref.m_evp.m_t_type 
         && fabs(objref.m_evp.m_t[0] + objref.m_evp.m_t[1] + objref.m_evp.m_t[2] + objref.m_evp.m_t[3] - 1.0) <= ON_SQRT_EPSILON )
    {
      if ( ci.m_index >= 0 && ci.m_index < m_F.Count() )
      {
        const int* fvi = m_F[ci.m_index].vi;
        if ( fvi[0] < 0 || fvi[0] >= m_V.Count() )
          break;
        if ( fvi[1] < 0 || fvi[1] >= m_V.Count() )
          break;
        if ( fvi[2] < 0 || fvi[2] >= m_V.Count() )
          break;
        if ( fvi[3] < 0 || fvi[3] >= m_V.Count() )
          break;
        ON_3dPoint V[4];
        V[0] = m_V[fvi[0]];
        V[1] = m_V[fvi[1]];
        V[2] = m_V[fvi[2]];
        V[3] = m_V[fvi[3]];
        P = objref.m_evp.m_t[0]*V[0] + objref.m_evp.m_t[1]*V[1] + objref.m_evp.m_t[2]*V[2] + objref.m_evp.m_t[3]*V[3];
      }
    }
    break;

  default:
    // intentionally skipping other ON_COMPONENT_INDEX::TYPE enum values
    break;
  }

  return P.IsValid();
}